

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rasm.c
# Opt level: O0

char * StringLooksLikeMacro(s_assenv *ae,char *str,int *retscore)

{
  int iVar1;
  int local_34;
  int score;
  int curs;
  int i;
  char *ret;
  int *retscore_local;
  char *str_local;
  s_assenv *ae_local;
  
  _curs = (char *)0x0;
  local_34 = 3;
  for (score = 0; score < ae->imacro; score = score + 1) {
    iVar1 = _internal_LevenshteinDistance(ae->macro[score].mnemo,str);
    if (iVar1 < local_34) {
      _curs = ae->macro[score].mnemo;
      local_34 = iVar1;
    }
  }
  if (retscore != (int *)0x0) {
    *retscore = local_34;
  }
  return _curs;
}

Assistant:

char *StringLooksLikeMacro(struct s_assenv *ae, char *str, int *retscore)
{
	#undef FUNC
	#define FUNC "StringLooksLikeMacro"
	
	char *ret=NULL;
	int i,curs,score=3;
	/* search in macros */
	for (i=0;i<ae->imacro;i++) {
		curs=_internal_LevenshteinDistance(ae->macro[i].mnemo,str);
		if (curs<score) {
			score=curs;
			ret=ae->macro[i].mnemo;
		}
	}
	if (retscore) *retscore=score;
	return ret;
}